

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int DisconnectSBGx(SBG *pSBG)

{
  int iVar1;
  char *__s;
  long lVar2;
  
  lVar2 = 0;
  while ((SBG *)addrsSBG[lVar2] != pSBG) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x10) {
      return 1;
    }
  }
  iVar1 = CloseRS232Port(&pSBG->RS232Port);
  __s = "SBG disconnection failed.";
  if (iVar1 == 0) {
    __s = "SBG disconnected.";
  }
  puts(__s);
  if (iVar1 != 0) {
    return 1;
  }
  addrsSBG[lVar2] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int DisconnectSBGx(SBG* pSBG)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectSBG(pSBG);
	if (res != EXIT_SUCCESS) return res;

	addrsSBG[id] = NULL;

	return EXIT_SUCCESS;
}